

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int ExpandMatrix(VP8Matrix *m,int type)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint32_t uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  long lVar10;
  
  lVar10 = 0;
  bVar6 = true;
  do {
    bVar9 = bVar6;
    bVar1 = kBiasMatrices[(uint)type][lVar10];
    uVar5 = 0x20000 / (ulong)m->q_[lVar10];
    m->iq_[lVar10] = (uint16_t)uVar5;
    uVar8 = (uint)bVar1 << 9;
    m->bias_[lVar10] = uVar8;
    m->zthresh_[lVar10] = (uint32_t)((ulong)(uVar8 ^ 0x1ffff) / (uVar5 & 0xffff));
    lVar10 = 1;
    bVar6 = false;
  } while (bVar9);
  uVar2 = m->q_[1];
  uVar4 = m->bias_[1];
  lVar10 = 0x12;
  do {
    m->q_[lVar10 + -0x10] = uVar2;
    m->q_[lVar10] = m->iq_[1];
    *(uint32_t *)(m->q_ + lVar10 * 2) = uVar4;
    m->bias_[lVar10] = m->zthresh_[1];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x20);
  lVar10 = 0;
  iVar7 = 0;
  do {
    if (type == 0) {
      uVar3 = m->q_[lVar10];
      m->sharpen_[lVar10] = (uint16_t)((uint)""[lVar10] * (uint)uVar3 >> 0xb);
    }
    else {
      m->sharpen_[lVar10] = 0;
      uVar3 = m->q_[lVar10];
    }
    iVar7 = iVar7 + (uint)uVar3;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  return iVar7 + 8U >> 4;
}

Assistant:

static int ExpandMatrix(VP8Matrix* const m, int type) {
  int i, sum;
  for (i = 0; i < 2; ++i) {
    const int is_ac_coeff = (i > 0);
    const int bias = kBiasMatrices[type][is_ac_coeff];
    m->iq_[i] = (1 << QFIX) / m->q_[i];
    m->bias_[i] = BIAS(bias);
    // zthresh_ is the exact value such that QUANTDIV(coeff, iQ, B) is:
    //   * zero if coeff <= zthresh
    //   * non-zero if coeff > zthresh
    m->zthresh_[i] = ((1 << QFIX) - 1 - m->bias_[i]) / m->iq_[i];
  }
  for (i = 2; i < 16; ++i) {
    m->q_[i] = m->q_[1];
    m->iq_[i] = m->iq_[1];
    m->bias_[i] = m->bias_[1];
    m->zthresh_[i] = m->zthresh_[1];
  }
  for (sum = 0, i = 0; i < 16; ++i) {
    if (type == 0) {  // we only use sharpening for AC luma coeffs
      m->sharpen_[i] = (kFreqSharpening[i] * m->q_[i]) >> SHARPEN_BITS;
    } else {
      m->sharpen_[i] = 0;
    }
    sum += m->q_[i];
  }
  return (sum + 8) >> 4;
}